

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::Message::ShortDebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  long lVar1;
  char *pcVar2;
  Printer local_24;
  Printer printer;
  Message *this_local;
  string *debug_string;
  
  printer.initial_indent_level_._3_1_ = 0;
  unique0x100000fa = this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TextFormat::Printer::Printer(&local_24);
  TextFormat::Printer::SetSingleLineMode(&local_24,true);
  TextFormat::Printer::PrintToString(&local_24,this,__return_storage_ptr__);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar2 == ' ') {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    }
  }
  printer.initial_indent_level_._3_1_ = 1;
  TextFormat::Printer::~Printer(&local_24);
  if ((printer.initial_indent_level_._3_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string Message::ShortDebugString() const {
  string debug_string;

  TextFormat::Printer printer;
  printer.SetSingleLineMode(true);

  printer.PrintToString(*this, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (debug_string.size() > 0 &&
      debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}